

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

bool FBaseCVar::ToBool(UCVarValue value,ECVarType type)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  float local_10;
  
  local_10 = value.Float;
  switch(type) {
  case CVAR_Bool:
    local_10._0_1_ = value.Bool;
    break;
  case CVAR_Int:
    bVar3 = local_10 == 0.0;
    goto LAB_00355732;
  case CVAR_Float:
    local_10._0_1_ = local_10 != 0.0;
    break;
  case CVAR_String:
    iVar1 = strcasecmp(value.String,"true");
    if (iVar1 == 0) {
      local_10._0_1_ = 1;
      break;
    }
    iVar1 = strcasecmp(value.String,"false");
    if (iVar1 == 0) goto switchD_003556d7_default;
    lVar2 = strtol(value.String,(char **)0x0,0);
    bVar3 = lVar2 == 0;
LAB_00355732:
    local_10._0_1_ = !bVar3;
    break;
  default:
switchD_003556d7_default:
    local_10._0_1_ = 0;
  }
  return (bool)(local_10._0_1_ & 1);
}

Assistant:

bool FBaseCVar::ToBool (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return value.Bool;

	case CVAR_Int:
		return !!value.Int;

	case CVAR_Float:
		return value.Float != 0.f;

	case CVAR_String:
		if (stricmp (value.String, "true") == 0)
			return true;
		else if (stricmp (value.String, "false") == 0)
			return false;
		else
			return !!strtol (value.String, NULL, 0);

	case CVAR_GUID:
		return false;

	default:
		return false;
	}
}